

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

void __thiscall OpenTable::act(OpenTable *this,Restaurant *restaurant)

{
  bool bVar1;
  ActionStatus AVar2;
  vector<Customer_*,_std::allocator<Customer_*>_> *this_00;
  undefined1 local_150 [64];
  reference local_110;
  Customer **customer;
  iterator __end2;
  iterator __begin2;
  vector<Customer_*,_std::allocator<Customer_*>_> *__range2;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [48];
  undefined1 local_80 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  Table *local_20;
  Table *temp;
  Restaurant *restaurant_local;
  OpenTable *this_local;
  
  temp = (Table *)restaurant;
  restaurant_local = (Restaurant *)this;
  local_20 = Restaurant::getTable(restaurant,*(int *)&(this->super_BaseAction).field_0x2c);
  if ((local_20 == (Table *)0x0) || (bVar1 = Table::isOpen(local_20), bVar1)) {
    std::operator<<((ostream *)&std::cout,"Table does not exist or is already open\n");
    Restaurant::logOpenTableMsg_abi_cxx11_((Restaurant *)local_80);
    std::operator+(local_80 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"open ");
    std::operator+(local_40,local_80 + 0x20);
    BaseAction::error(&this->super_BaseAction,local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)(local_80 + 0x20));
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    Table::openTable(local_20);
    this_00 = Table::getCustomers(local_20);
    std::vector<Customer_*,_std::allocator<Customer_*>_>::operator=(this_00,&this->customers);
    BaseAction::complete(&this->super_BaseAction);
  }
  AVar2 = BaseAction::getStatus(&this->super_BaseAction);
  if (AVar2 == COMPLETED) {
    std::__cxx11::to_string((__cxx11 *)&__range2,*(int *)&(this->super_BaseAction).field_0x2c);
    std::operator+((char *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"open ");
    std::operator+(local_b0,(char *)local_d0);
    std::__cxx11::string::operator=((string *)&this->completeMessage,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&__range2);
    __end2 = std::vector<Customer_*,_std::allocator<Customer_*>_>::begin(&this->customers);
    customer = (Customer **)
               std::vector<Customer_*,_std::allocator<Customer_*>_>::end(&this->customers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>
                                       *)&customer), bVar1) {
      local_110 = __gnu_cxx::
                  __normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>
                  ::operator*(&__end2);
      (*(*local_110)->_vptr_Customer[3])();
      std::__cxx11::string::append((string *)&this->completeMessage);
      std::__cxx11::string::~string((string *)(local_150 + 0x20));
      __gnu_cxx::
      __normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>::
      operator++(&__end2);
    }
    std::__cxx11::string::append((char *)&this->completeMessage);
  }
  else {
    AVar2 = BaseAction::getStatus(&this->super_BaseAction);
    if (AVar2 == ERROR) {
      BaseAction::getErrorMsg_abi_cxx11_((BaseAction *)local_150);
      std::__cxx11::string::append((string *)&this->completeMessage);
      std::__cxx11::string::~string((string *)local_150);
    }
    else {
      std::__cxx11::string::append((char *)&this->completeMessage);
    }
  }
  return;
}

Assistant:

void OpenTable::act(Restaurant &restaurant) {
    Table* temp = restaurant.getTable(tableId);
    if(temp == nullptr || temp->isOpen())
    {
        std::cout << "Table does not exist or is already open\n";
        error("open " + restaurant.logOpenTableMsg() + "Error: Table does not exist or is already open");
    }
    else
    {
        temp->openTable();
        temp->getCustomers() = customers;
        complete();
    }

    if(getStatus() == ActionStatus::COMPLETED)
    {

        completeMessage = "open " + std::to_string(tableId) + " " ;
        for (auto &customer : customers) {
            completeMessage.append(customer->toString());
        }
        completeMessage.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        completeMessage.append(getErrorMsg());
    }
    else completeMessage.append("Pending");

}